

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O2

void __thiscall
notch::core::ConvolutionLayer2D<3UL>::ConvolutionLayer2D
          (ConvolutionLayer2D<3UL> *this,size_t imageWidth,size_t imageHeight)

{
  uint in_EAX;
  valarray<float> *pvVar1;
  undefined8 uStack_28;
  
  (this->super_ABackpropLayer).shared.outputBuffer.
  super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_ABackpropLayer).shared.outputBuffer.
  super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_ABackpropLayer).shared.inputBuffer.
  super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_ABackpropLayer).shared.inputBuffer.
  super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_ABackpropLayer)._vptr_ABackpropLayer = (_func_int **)&PTR_tag_abi_cxx11__001b16c8;
  this->inputWidth = imageWidth;
  this->inputHeight = imageHeight;
  this->inputSize = imageHeight * imageWidth;
  this->outputWidth = imageWidth - 2;
  this->outputHeight = imageHeight - 2;
  this->outputSize = (imageHeight - 2) * (imageWidth - 2);
  uStack_28._0_4_ = in_EAX;
  pvVar1 = (valarray<float> *)operator_new(0x10);
  uStack_28 = (ulong)(uint)uStack_28;
  std::valarray<float>::valarray(pvVar1,(float *)((long)&uStack_28 + 4),9);
  ::std::__shared_ptr<std::valarray<float>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::valarray<float>,void>
            ((__shared_ptr<std::valarray<float>,(__gnu_cxx::_Lock_policy)2> *)&this->weights,pvVar1)
  ;
  pvVar1 = (valarray<float> *)operator_new(0x10);
  uStack_28 = uStack_28 & 0xffffffff;
  std::valarray<float>::valarray(pvVar1,(float *)((long)&uStack_28 + 4),1);
  ::std::__shared_ptr<std::valarray<float>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::valarray<float>,void>
            ((__shared_ptr<std::valarray<float>,(__gnu_cxx::_Lock_policy)2> *)&this->bias,pvVar1);
  uStack_28 = uStack_28 & 0xffffffff;
  std::valarray<float>::valarray(&this->localGrad,(float *)((long)&uStack_28 + 4),this->outputSize);
  pvVar1 = (valarray<float> *)operator_new(0x10);
  uStack_28 = uStack_28 & 0xffffffff;
  std::valarray<float>::valarray(pvVar1,(float *)((long)&uStack_28 + 4),9);
  ::std::__shared_ptr<std::valarray<float>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::valarray<float>,void>
            ((__shared_ptr<std::valarray<float>,(__gnu_cxx::_Lock_policy)2> *)
             &this->weightSensitivity,pvVar1);
  pvVar1 = (valarray<float> *)operator_new(0x10);
  uStack_28 = uStack_28 & 0xffffffff;
  std::valarray<float>::valarray(pvVar1,(float *)((long)&uStack_28 + 4),1);
  ::std::__shared_ptr<std::valarray<float>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::valarray<float>,void>
            ((__shared_ptr<std::valarray<float>,(__gnu_cxx::_Lock_policy)2> *)&this->biasSensitivity
             ,pvVar1);
  uStack_28 = uStack_28 & 0xffffffff;
  std::valarray<float>::valarray
            (&this->propagatedErrors,(float *)((long)&uStack_28 + 4),this->inputSize);
  (this->policy).super___shared_ptr<notch::core::ALearningPolicy,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->policy).super___shared_ptr<notch::core::ALearningPolicy,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  return;
}

Assistant:

ConvolutionLayer2D(size_t imageWidth, size_t imageHeight)
        : inputWidth(imageWidth), inputHeight(imageHeight),
          inputSize(inputWidth * inputHeight),
          outputWidth(imageWidth - kernelSize + 1),
          outputHeight(imageHeight - kernelSize + 1),
          outputSize(outputWidth * outputHeight),
          weights(new Array(0.0, kernelSize*kernelSize)),
          bias(new Array(0.0, 1)),
          localGrad(0.0, outputSize),
          weightSensitivity(new Array(0.0, kernelSize*kernelSize)),
          biasSensitivity(new Array(0.0, 1)),
          propagatedErrors(0.0, inputSize)
          {}